

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O3

Packet * __thiscall mognetwork::Packet::operator<<(Packet *this,char *data)

{
  vector<char,_std::allocator<char>_> *this_00;
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = strlen(data);
  this_00 = this->m_data;
  uVar2 = (long)(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  std::vector<char,_std::allocator<char>_>::resize(this_00,(ulong)((int)uVar2 + 4),'\0');
  *(uint *)((this->m_data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start + (uVar2 & 0xffffffff)) = (uint)sVar1;
  push(this,data,(uint)sVar1);
  return this;
}

Assistant:

Packet& Packet::operator<<(const char* data)
  {
    int32_t size = strlen(data) * sizeof(char);
    *this << size;
    push(data, size);
    return (*this);
  }